

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O0

void __thiscall wabt::OpcodeInfo::Write(OpcodeInfo *this,Stream *stream)

{
  uint uVar1;
  unsigned_long uVar2;
  bool bVar3;
  Index IVar4;
  Enum EVar5;
  char *pcVar6;
  float *pfVar7;
  uint *puVar8;
  double *pdVar9;
  unsigned_long *puVar10;
  Type *pTVar11;
  anon_class_8_1_6bf940be local_80;
  Type local_74;
  anon_class_8_1_6bf940be aStack_70;
  Type type;
  char local_68 [8];
  char buffer_1 [41];
  char buffer [21];
  Stream *stream_local;
  OpcodeInfo *this_local;
  
  pcVar6 = Opcode::GetName(&this->opcode_);
  Stream::Writef(stream,"%s",pcVar6);
  switch(this->kind_) {
  case Bare:
    break;
  case Uint32:
    puVar8 = GetData<unsigned_int>(this,1);
    uVar1 = *puVar8;
    puVar8 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u (0x%x)",(ulong)uVar1,(ulong)*puVar8);
    break;
  case Uint64:
    puVar10 = GetData<unsigned_long>(this,1);
    uVar2 = *puVar10;
    puVar10 = GetData<unsigned_long>(this,1);
    Stream::Writef(stream," %lu (0x%lx)",uVar2,*puVar10);
    break;
  case Index:
    puVar8 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u",(ulong)*puVar8);
    break;
  case Float32:
    pfVar7 = GetData<float>(this,1);
    Stream::Writef(stream," %g",(double)*pfVar7);
    puVar8 = GetData<unsigned_int>(this,1);
    WriteFloatHex(buffer_1 + 0x28,0x15,*puVar8);
    Stream::Writef(stream," (%s)",buffer_1 + 0x28);
    break;
  case Float64:
    pdVar9 = GetData<double>(this,1);
    Stream::Writef(stream," %g",*pdVar9);
    puVar10 = GetData<unsigned_long>(this,1);
    WriteDoubleHex(local_68,0x29,*puVar10);
    Stream::Writef(stream," (%s)",local_68);
    break;
  case Uint32Uint32:
    aStack_70.stream = stream;
    WriteArray<unsigned_int,wabt::OpcodeInfo::Write(wabt::Stream&)::__0>
              (this,stream,&stack0xffffffffffffff90);
    break;
  case BlockSig:
    pTVar11 = GetData<wabt::Type>(this,1);
    local_74.enum_ = pTVar11->enum_;
    bVar3 = Type::IsIndex(&local_74);
    if (bVar3) {
      IVar4 = Type::GetIndex(&local_74);
      Stream::Writef(stream," type:%d",(ulong)IVar4);
    }
    else {
      EVar5 = Type::operator_cast_to_Enum(&local_74);
      if (EVar5 != Void) {
        pcVar6 = Type::GetName(&local_74);
        Stream::Writef(stream," %s",pcVar6);
      }
    }
    break;
  case BrTable:
    local_80.stream = stream;
    WriteArray<unsigned_int,wabt::OpcodeInfo::Write(wabt::Stream&)::__1>(this,stream,&local_80);
  }
  return;
}

Assistant:

void OpcodeInfo::Write(Stream& stream) {
  stream.Writef("%s", opcode_.GetName());

  switch (kind_) {
    case Kind::Bare:
      break;

    case Kind::Uint32:
      stream.Writef(" %u (0x%x)", *GetData<uint32_t>(), *GetData<uint32_t>());
      break;

    case Kind::Uint64:
      stream.Writef(" %" PRIu64 " (0x%" PRIx64 ")", *GetData<uint64_t>(),
                    *GetData<uint64_t>());
      break;

    case Kind::Index:
      stream.Writef(" %" PRIindex, *GetData<Index>());
      break;

    case Kind::Float32: {
      stream.Writef(" %g", *GetData<float>());
      char buffer[WABT_MAX_FLOAT_HEX + 1];
      WriteFloatHex(buffer, sizeof(buffer), *GetData<uint32_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Float64: {
      stream.Writef(" %g", *GetData<double>());
      char buffer[WABT_MAX_DOUBLE_HEX + 1];
      WriteDoubleHex(buffer, sizeof(buffer), *GetData<uint64_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Uint32Uint32:
      WriteArray<uint32_t>(
          stream, [&stream](uint32_t value) { stream.Writef("%u", value); });
      break;

    case Kind::BlockSig: {
      auto type = *GetData<Type>();
      if (type.IsIndex()) {
        stream.Writef(" type:%d", type.GetIndex());
      } else if (type != Type::Void) {
        stream.Writef(" %s", type.GetName());
      }
      break;
    }

    case Kind::BrTable: {
      WriteArray<Index>(stream, [&stream](Index index) {
        stream.Writef("%" PRIindex, index);
      });
      break;
    }
  }
}